

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O2

PyObject * libxml_xmlValidatePushCData(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *pPVar2;
  undefined8 uVar3;
  int len;
  xmlChar *data;
  PyObject *pyobj_ctxt;
  undefined4 local_24;
  undefined8 local_20;
  undefined *local_18;
  
  iVar1 = libxml_deprecationWarning("xmlValidatePushCData");
  if (iVar1 == -1) {
    pPVar2 = (PyObject *)0x0;
  }
  else {
    pPVar2 = (PyObject *)0x0;
    iVar1 = _PyArg_ParseTuple_SizeT(args,"Ozi:xmlValidatePushCData",&local_18,&local_20,&local_24);
    if (iVar1 != 0) {
      if (local_18 == &_Py_NoneStruct) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(undefined8 *)(local_18 + 0x10);
      }
      iVar1 = xmlValidatePushCData(uVar3,local_20,local_24);
      pPVar2 = libxml_intWrap(iVar1);
    }
  }
  return pPVar2;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlValidatePushCData(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    int c_retval;
    xmlValidCtxtPtr ctxt;
    PyObject *pyobj_ctxt;
    xmlChar * data;
    int len;

    if (libxml_deprecationWarning("xmlValidatePushCData") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"Ozi:xmlValidatePushCData", &pyobj_ctxt, &data, &len))
        return(NULL);
    ctxt = (xmlValidCtxtPtr) PyValidCtxt_Get(pyobj_ctxt);

    c_retval = xmlValidatePushCData(ctxt, data, len);
    py_retval = libxml_intWrap((int) c_retval);
    return(py_retval);
}